

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

fdb_status fdb_iterator_prev(fdb_iterator *iterator)

{
  bool bVar1;
  fdb_iterator *in_RDI;
  fdb_status result;
  fdb_iterator *in_stack_00000068;
  memory_order local_4;
  
  if ((in_RDI == (fdb_iterator *)0x0) || (*(long *)&in_RDI->handle == 0)) {
    local_4 = 0xffffffe2;
  }
  else {
    bVar1 = atomic_cas_uint8_t((atomic<unsigned_char> *)in_RDI,'\0','\0');
    if (bVar1) {
      if (in_RDI->hbtrie_iterator == (hbtrie_iterator *)0x0) {
        do {
          local_4 = _fdb_iterator_seq_prev(in_RDI);
        } while (local_4 == 0xfffffff7);
      }
      else {
        do {
          local_4 = _fdb_iterator_prev(in_stack_00000068);
        } while (local_4 == 0xfffffff7);
      }
      if (local_4 == memory_order_relaxed) {
        in_RDI->direction = '\x02';
      }
      else {
        in_RDI->_dhandle = (docio_handle *)0x0;
        if ((in_RDI->direction != '\0') &&
           (((in_RDI->seqtree_iterator != (btree_iterator *)0x0 ||
             (in_RDI->seqtrie_iterator != (hbtrie_iterator *)0x0)) && (in_RDI->status == '\0')))) {
          in_RDI->_offset = 0xffffffffffffffff;
        }
      }
      atomic_cas_uint8_t((atomic<unsigned_char> *)in_RDI,(uint8_t)(local_4 >> 0x18),
                         (uint8_t)(local_4 >> 0x10));
      atomic_incr_uint64_t((atomic<unsigned_long> *)in_RDI,local_4);
    }
    else {
      local_4 = 0xffffffd9;
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_prev(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status result = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (!atomic_cas_uint8_t(&iterator->handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (iterator->hbtrie_iterator) {
        while ((result = _fdb_iterator_prev(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    } else {
        while ((result = _fdb_iterator_seq_prev(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    }
    if (result == FDB_RESULT_SUCCESS) {
        iterator->direction = FDB_ITR_REVERSE;
    } else {
        iterator->_dhandle = NULL; // fail fdb_iterator_get also
        if (iterator->direction != FDB_ITR_DIR_NONE) {
            if ((iterator->seqtree_iterator || iterator->seqtrie_iterator) &&
                    iterator->status == FDB_ITR_IDX) {
                iterator->_offset = BLK_NOT_FOUND;
            }
        }
    }

    atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
    atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_moves,
                         std::memory_order_relaxed);
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_PREV);
    return result;
}